

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O1

bool __thiscall
duckdb::CSVReaderOptions::SetBaseOption
          (CSVReaderOptions *this,string *loption,Value *value,bool write_option)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_00;
  LogicalTypeId LVar1;
  pointer pcVar2;
  pointer pVVar3;
  bool bVar4;
  bool bVar5;
  FileCompressionType FVar6;
  int iVar7;
  LogicalType *pLVar8;
  vector<duckdb::Value,_true> *pvVar9;
  const_reference value_00;
  string *psVar10;
  BinderException *pBVar11;
  undefined7 in_register_00000009;
  pointer value_01;
  Value local_1b8;
  undefined4 local_174;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_174 = (undefined4)CONCAT71(in_register_00000009,write_option);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  pcVar2 = (loption->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar2,pcVar2 + loption->_M_string_length);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"delim","");
  bVar4 = StringUtil::StartsWith(&local_150,&local_170);
  bVar5 = true;
  if (!bVar4) {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    pcVar2 = (loption->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar2,pcVar2 + loption->_M_string_length);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"sep","");
    bVar5 = StringUtil::StartsWith(&local_130,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if (bVar5 == false) {
    iVar7 = ::std::__cxx11::string::compare((char *)loption);
    if (iVar7 == 0) {
      ParseString((string *)&local_1b8,value,loption);
      SetQuote(this,(string *)&local_1b8);
    }
    else {
      iVar7 = ::std::__cxx11::string::compare((char *)loption);
      if (iVar7 == 0) {
        ParseString((string *)&local_1b8,value,loption);
        SetComment(this,(string *)&local_1b8);
      }
      else {
        iVar7 = ::std::__cxx11::string::compare((char *)loption);
        if (iVar7 == 0) {
          ParseString((string *)&local_1b8,value,loption);
          SetNewline(this,(string *)&local_1b8);
        }
        else {
          iVar7 = ::std::__cxx11::string::compare((char *)loption);
          if (iVar7 == 0) {
            ParseString((string *)&local_1b8,value,loption);
            SetEscape(this,(string *)&local_1b8);
          }
          else {
            iVar7 = ::std::__cxx11::string::compare((char *)loption);
            if (iVar7 == 0) {
              bVar5 = ParseBoolean(value,loption);
              if ((this->dialect_options).header.set_by_user != false) {
                return true;
              }
              (this->dialect_options).header.value = bVar5;
              (this->dialect_options).header.set_by_user = true;
              return true;
            }
            iVar7 = ::std::__cxx11::string::compare((char *)loption);
            if ((iVar7 == 0) ||
               (iVar7 = ::std::__cxx11::string::compare((char *)loption), iVar7 == 0)) {
              this_00 = &this->null_str;
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this_00);
              LVar1 = (value->type_).id_;
              if ((LVar1 != VARCHAR) && (LVar1 != LIST)) {
                pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
                local_1b8.type_._0_8_ = (long)&local_1b8 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1b8,
                           "CSV Reader function option %s requires a string or a list as input","");
                local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                pcVar2 = (loption->_M_dataplus)._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_70,pcVar2,pcVar2 + loption->_M_string_length);
                BinderException::BinderException<std::__cxx11::string>
                          (pBVar11,(string *)&local_1b8,&local_70);
                __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
              if ((this->null_str).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (this->null_str).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
                local_1b8.type_._0_8_ = (long)&local_1b8 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1b8,
                           "CSV Reader function option nullstr can only be supplied once","");
                BinderException::BinderException(pBVar11,(string *)&local_1b8);
                __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
              if (LVar1 == LIST) {
                pLVar8 = ListType::GetChildType(&value->type_);
                if (pLVar8->id_ == VARCHAR) {
                  pvVar9 = (vector<duckdb::Value,_true> *)0x0;
                }
                else {
                  if (pLVar8->id_ != LIST) {
                    pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
                    local_1b8.type_._0_8_ = (long)&local_1b8 + 0x10;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_1b8,
                               "CSV Reader function option %s requires a non-empty list of possible null strings (varchar) as input"
                               ,"");
                    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
                    pcVar2 = (loption->_M_dataplus)._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_b0,pcVar2,pcVar2 + loption->_M_string_length);
                    BinderException::BinderException<std::__cxx11::string>
                              (pBVar11,(string *)&local_1b8,&local_b0);
                    __cxa_throw(pBVar11,&BinderException::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  pLVar8 = ListType::GetChildType(pLVar8);
                  pvVar9 = ListValue::GetChildren(value);
                  if ((pLVar8->id_ != VARCHAR) ||
                     ((long)(pvVar9->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar9->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                            _M_impl.super__Vector_impl_data._M_start != 0x40)) {
                    pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
                    local_1b8.type_._0_8_ = (long)&local_1b8 + 0x10;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_1b8,
                               "CSV Reader function option %s requires a non-empty list of possible null strings (varchar) as input"
                               ,"");
                    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                    pcVar2 = (loption->_M_dataplus)._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_90,pcVar2,pcVar2 + loption->_M_string_length);
                    BinderException::BinderException<std::__cxx11::string>
                              (pBVar11,(string *)&local_1b8,&local_90);
                    __cxa_throw(pBVar11,&BinderException::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  value_00 = vector<duckdb::Value,_true>::back(pvVar9);
                  pvVar9 = ListValue::GetChildren(value_00);
                }
                if (pvVar9 == (vector<duckdb::Value,_true> *)0x0) {
                  pvVar9 = ListValue::GetChildren(value);
                }
                pVVar3 = (pvVar9->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                         super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                for (value_01 = (pvVar9->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                                ).super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                _M_impl.super__Vector_impl_data._M_start; value_01 != pVVar3;
                    value_01 = value_01 + 1) {
                  if (value_01->is_null == true) {
                    pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
                    local_1b8.type_._0_8_ = (long)&local_1b8 + 0x10;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_1b8,
                               "CSV Reader function option %s does not accept NULL values as a valid nullstr option"
                               ,"");
                    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                    pcVar2 = (loption->_M_dataplus)._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_d0,pcVar2,pcVar2 + loption->_M_string_length);
                    BinderException::BinderException<std::__cxx11::string>
                              (pBVar11,(string *)&local_1b8,&local_d0);
                    __cxa_throw(pBVar11,&BinderException::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  psVar10 = StringValue::Get_abi_cxx11_(value_01);
                  ::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)this_00,psVar10);
                }
              }
              else {
                ParseString(&local_50,value,loption);
                Value::Value(&local_1b8,&local_50);
                psVar10 = StringValue::Get_abi_cxx11_(&local_1b8);
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)this_00,psVar10);
                Value::~Value(&local_1b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p);
                }
              }
              if ((char)local_174 != '\x01' ||
                  (ulong)((long)(this->null_str).
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->null_str).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
                return true;
              }
              pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
              local_1b8.type_._0_8_ = (long)&local_1b8 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1b8,
                         "CSV Writer function option %s only accepts one nullstr value.","");
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              pcVar2 = (loption->_M_dataplus)._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_f0,pcVar2,pcVar2 + loption->_M_string_length);
              BinderException::BinderException<std::__cxx11::string>
                        (pBVar11,(string *)&local_1b8,&local_f0);
              __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            iVar7 = ::std::__cxx11::string::compare((char *)loption);
            if (iVar7 != 0) {
              iVar7 = ::std::__cxx11::string::compare((char *)loption);
              if (iVar7 != 0) {
                return false;
              }
              bVar5 = ParseBoolean(value,loption);
              if ((this->dialect_options).state_machine_options.strict_mode.set_by_user != false) {
                return true;
              }
              (this->dialect_options).state_machine_options.strict_mode.value = bVar5;
              (this->dialect_options).state_machine_options.strict_mode.set_by_user = true;
              return true;
            }
            ParseString((string *)&local_1b8,value,loption);
            FVar6 = FileCompressionTypeFromString((string *)&local_1b8);
            this->compression = FVar6;
          }
        }
      }
    }
  }
  else {
    ParseString((string *)&local_1b8,value,loption);
    SetDelimiter(this,(string *)&local_1b8);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_1b8.type_._0_8_ !=
      (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_1b8 + 0x10U)) {
    operator_delete((void *)local_1b8.type_._0_8_);
  }
  return true;
}

Assistant:

bool CSVReaderOptions::SetBaseOption(const string &loption, const Value &value, bool write_option) {
	// Make sure this function was only called after the option was turned into lowercase
	D_ASSERT(!std::any_of(loption.begin(), loption.end(), ::isupper));

	if (StringUtil::StartsWith(loption, "delim") || StringUtil::StartsWith(loption, "sep")) {
		SetDelimiter(ParseString(value, loption));
	} else if (loption == "quote") {
		SetQuote(ParseString(value, loption));
	} else if (loption == "comment") {
		SetComment(ParseString(value, loption));
	} else if (loption == "new_line") {
		SetNewline(ParseString(value, loption));
	} else if (loption == "escape") {
		SetEscape(ParseString(value, loption));
	} else if (loption == "header") {
		SetHeader(ParseBoolean(value, loption));
	} else if (loption == "nullstr" || loption == "null") {
		auto &child_type = value.type();
		null_str.clear();
		if (child_type.id() != LogicalTypeId::LIST && child_type.id() != LogicalTypeId::VARCHAR) {
			throw BinderException("CSV Reader function option %s requires a string or a list as input", loption);
		}
		if (!null_str.empty()) {
			throw BinderException("CSV Reader function option nullstr can only be supplied once");
		}
		if (child_type.id() == LogicalTypeId::LIST) {
			auto &list_child = ListType::GetChildType(child_type);
			const vector<Value> *children = nullptr;
			if (list_child.id() == LogicalTypeId::LIST) {
				// This can happen if it comes from a copy FROM/TO
				auto &list_grandchild = ListType::GetChildType(list_child);
				auto &children_ref = ListValue::GetChildren(value);
				if (list_grandchild.id() != LogicalTypeId::VARCHAR || children_ref.size() != 1) {
					throw BinderException("CSV Reader function option %s requires a non-empty list of possible null "
					                      "strings (varchar) as input",
					                      loption);
				}
				children = &ListValue::GetChildren(children_ref.back());
			} else if (list_child.id() != LogicalTypeId::VARCHAR) {
				throw BinderException("CSV Reader function option %s requires a non-empty list of possible null "
				                      "strings (varchar) as input",
				                      loption);
			}
			if (!children) {
				children = &ListValue::GetChildren(value);
			}
			for (auto &child : *children) {
				if (child.IsNull()) {
					throw BinderException(
					    "CSV Reader function option %s does not accept NULL values as a valid nullstr option", loption);
				}
				null_str.push_back(StringValue::Get(child));
			}
		} else {
			null_str.push_back(StringValue::Get(ParseString(value, loption)));
		}
		if (null_str.size() > 1 && write_option) {
			throw BinderException("CSV Writer function option %s only accepts one nullstr value.", loption);
		}

	} else if (loption == "compression") {
		SetCompression(ParseString(value, loption));
	} else if (loption == "strict_mode") {
		SetRFC4180(ParseBoolean(value, loption));
	} else {
		// unrecognized option in base CSV
		return false;
	}
	return true;
}